

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

QRgbaFloat32 *
fetchRGBA16FToRGBA32F_avx2
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  QRgbaFloat32 *pQVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QRgbaFloat32 *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  __m128 vsa_1;
  __m128 vsf_1;
  __m256 vsa;
  __m256 vsf;
  int i;
  quint64 *s;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  undefined1 local_1d0 [8];
  undefined8 uStack_1c8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  int local_174;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  
  lVar3 = in_RSI + (long)in_EDX * 8;
  for (local_174 = 0; local_174 + 1 < in_ECX; local_174 = local_174 + 2) {
    vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    auVar2 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar3 + (long)local_174 * 8));
    auVar1 = vpermilps_avx(auVar2,0xff);
    local_120 = auVar2._0_4_;
    fStack_11c = auVar2._4_4_;
    fStack_118 = auVar2._8_4_;
    fStack_114 = auVar2._12_4_;
    fStack_110 = auVar2._16_4_;
    fStack_10c = auVar2._20_4_;
    fStack_108 = auVar2._24_4_;
    uStack_104 = auVar2._28_4_;
    local_140 = auVar1._0_4_;
    fStack_13c = auVar1._4_4_;
    fStack_138 = auVar1._8_4_;
    fStack_134 = auVar1._12_4_;
    fStack_130 = auVar1._16_4_;
    fStack_12c = auVar1._20_4_;
    fStack_128 = auVar1._24_4_;
    local_1a0._4_4_ = fStack_11c * fStack_13c;
    local_1a0._0_4_ = local_120 * local_140;
    fStack_198 = fStack_118 * fStack_138;
    fStack_194 = fStack_114 * fStack_134;
    fStack_190 = fStack_110 * fStack_130;
    fStack_18c = fStack_10c * fStack_12c;
    fStack_188 = fStack_108 * fStack_128;
    uStack_184 = uStack_104;
    auVar1 = vblendps_avx(_local_1a0,auVar1,0x88);
    in_ZMM0 = ZEXT3264(auVar1);
    *(undefined1 (*) [32])(in_RDI + local_174) = auVar1;
  }
  if (local_174 < in_ECX) {
    vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(lVar3 + (long)local_174 * 8);
    auVar5 = vcvtph2ps_f16c(auVar5);
    uStack_1c8._4_4_ = auVar5._12_4_;
    local_1e0._4_4_ = uStack_1c8._4_4_;
    local_1e0._0_4_ = uStack_1c8._4_4_;
    fStack_1d8 = uStack_1c8._4_4_;
    fStack_1d4 = uStack_1c8._4_4_;
    local_b0 = auVar5._0_4_;
    fStack_ac = auVar5._4_4_;
    fStack_a8 = auVar5._8_4_;
    local_1d0._4_4_ = fStack_ac * uStack_1c8._4_4_;
    local_1d0._0_4_ = local_b0 * uStack_1c8._4_4_;
    uStack_1c8._0_4_ = fStack_a8 * uStack_1c8._4_4_;
    uStack_1c8._4_4_ = uStack_1c8._4_4_ * uStack_1c8._4_4_;
    auVar5 = vinsertps_avx(_local_1d0,_local_1e0,0x30);
    pQVar4 = in_RDI + local_174;
    local_1d0 = auVar5._0_8_;
    uStack_1c8 = auVar5._8_8_;
    pQVar4->r = (float)local_1d0._0_4_;
    pQVar4->g = (float)local_1d0._4_4_;
    pQVar4->b = (float)(undefined4)uStack_1c8;
    pQVar4->a = uStack_1c8._4_4_;
  }
  return in_RDI;
}

Assistant:

const QRgbaFloat32 *QT_FASTCALL fetchRGBA16FToRGBA32F_avx2(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        _mm256_storeu_ps((float *)(buffer + i), vsf);
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        _mm_storeu_ps((float *)(buffer + i), vsf);
    }
    return buffer;
}